

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

string * __thiscall CTxIn::ToString_abi_cxx11_(CTxIn *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  COutPoint *in_RDI;
  long in_FS_OFFSET;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  COutPoint *__pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 uVar2;
  Span<const_unsigned_char> in_stack_ffffffffffffff30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  __pos = in_RDI;
  std::__cxx11::string::string(in_RSI);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  COutPoint::ToString_abi_cxx11_((COutPoint *)CONCAT17(uVar2,in_stack_fffffffffffffee0));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  std::__cxx11::string::~string(in_stack_fffffffffffffea8);
  uVar2 = COutPoint::IsNull(in_RDI);
  if ((bool)uVar2) {
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)in_RDI,
               (CScript *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8);
    HexStr_abi_cxx11_(in_stack_ffffffffffffff30);
    tinyformat::format<std::__cxx11::string>(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffeb0));
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
  }
  else {
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)in_RDI,
               (CScript *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8);
    HexStr_abi_cxx11_(in_stack_ffffffffffffff30);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffed0,(size_type)__pos,(size_type)in_RSI);
    tinyformat::format<std::__cxx11::string>(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffeb0));
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
  }
  if ((int)in_RSI[2]._M_string_length != -1) {
    tinyformat::format<unsigned_int>(in_stack_fffffffffffffed8,(uint *)in_stack_fffffffffffffed0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffeb0));
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)CONCAT17(uVar2,in_stack_fffffffffffffeb0));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (string *)in_RDI;
}

Assistant:

std::string CTxIn::ToString() const
{
    std::string str;
    str += "CTxIn(";
    str += prevout.ToString();
    if (prevout.IsNull())
        str += strprintf(", coinbase %s", HexStr(scriptSig));
    else
        str += strprintf(", scriptSig=%s", HexStr(scriptSig).substr(0, 24));
    if (nSequence != SEQUENCE_FINAL)
        str += strprintf(", nSequence=%u", nSequence);
    str += ")";
    return str;
}